

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewWritableFile
          (PosixEnv *this,string *filename,WritableFile **result)

{
  char *__file;
  void *pvVar1;
  undefined8 *in_RCX;
  string *in_RDX;
  PosixWritableFile *in_RDI;
  int fd;
  undefined8 in_stack_ffffffffffffffa0;
  PosixWritableFile *this_00;
  string local_48 [36];
  int local_24;
  
  this_00 = in_RDI;
  __file = (char *)std::__cxx11::string::c_str();
  local_24 = open(__file,0x80241,0x1a4);
  if (local_24 < 0) {
    *in_RCX = 0;
    __errno_location();
    PosixError(in_RDX,(int)((ulong)in_RCX >> 0x20));
  }
  else {
    pvVar1 = operator_new(0x10058);
    std::__cxx11::string::string(local_48,(string *)in_RDX);
    PosixWritableFile::PosixWritableFile
              (this_00,(string *)in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    *in_RCX = pvVar1;
    std::__cxx11::string::~string(local_48);
    Status::OK();
  }
  return (Status)(char *)this_00;
}

Assistant:

Status NewWritableFile(const std::string& filename,
                         WritableFile** result) override {
    int fd = ::open(filename.c_str(),
                    O_TRUNC | O_WRONLY | O_CREAT | kOpenBaseFlags, 0644);
    if (fd < 0) {
      *result = nullptr;
      return PosixError(filename, errno);
    }

    *result = new PosixWritableFile(filename, fd);
    return Status::OK();
  }